

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O3

void __thiscall docopt::value::~value(value *this)

{
  pointer pbVar1;
  
  if (this->kind == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->variant).strList);
    return;
  }
  if ((this->kind == String) &&
     (pbVar1 = (this->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     pbVar1 != (pointer)((long)&this->variant + 0x10))) {
    operator_delete(pbVar1);
    return;
  }
  return;
}

Assistant:

inline
	value::~value()
	{
		switch (kind) {
			case Kind::String:
				variant.strValue.~basic_string();
				break;

			case Kind::StringList:
				variant.strList.~vector();
				break;

			case Kind::Empty:
			case Kind::Bool:
			case Kind::Long:
			default:
				// trivial dtor
				break;
		}
	}